

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O1

int __thiscall CDefineTable::Remove(CDefineTable *this,char *name)

{
  byte bVar1;
  int iVar2;
  CDefineTableEntry *pCVar3;
  CDefineTableEntry **ppCVar4;
  CDefineTableEntry *this_00;
  
  bVar1 = *name;
  this_00 = this->defs[bVar1 & 0x7f];
  if (this_00 == (CDefineTableEntry *)0x0) {
LAB_00131dbb:
    iVar2 = 0;
  }
  else {
    iVar2 = strcmp(name,this_00->name);
    if (iVar2 == 0) {
      pCVar3 = (CDefineTableEntry *)0x0;
    }
    else {
      do {
        pCVar3 = this_00;
        this_00 = pCVar3->next;
        if (this_00 == (CDefineTableEntry *)0x0) goto LAB_00131dbb;
        iVar2 = strcmp(name,this_00->name);
      } while (iVar2 != 0);
    }
    ppCVar4 = &pCVar3->next;
    if (pCVar3 == (CDefineTableEntry *)0x0) {
      ppCVar4 = this->defs + (bVar1 & 0x7f);
    }
    *ppCVar4 = this_00->next;
    this_00->next = (CDefineTableEntry *)0x0;
    CDefineTableEntry::~CDefineTableEntry(this_00);
    operator_delete(this_00,0x20);
    this->DefArrayList = (CStringsList *)0x0;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int CDefineTable::Remove(const char* name) {
	CDefineTableEntry* p = defs[(*name)&127];
	CDefineTableEntry* p2 = NULL;
	while (p) {
		if (!strcmp(name, p->name)) {
			// unchain the particular item
			if (NULL == p2) defs[(*name)&127] = p->next;
			else			p2->next = p->next;
			p->next = NULL;
			// delete it
			delete p;
			DefArrayList = NULL;		// may be invalid here, so just reset it
			return 1;
		}
		p2 = p;
		p = p->next;
	}
	return 0;
}